

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.c
# Opt level: O2

void chacha20_quarter_round(uint32_t *state,size_t a,size_t b,size_t c,size_t d)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  
  uVar1 = state[a];
  uVar2 = state[b];
  state[a] = uVar1 + uVar2;
  uVar3 = uVar1 + uVar2 ^ state[d];
  uVar3 = uVar3 << 0x10 | uVar3 >> 0x10;
  state[d] = uVar3;
  uVar3 = uVar3 + state[c];
  state[c] = uVar3;
  uVar3 = uVar3 ^ state[b];
  uVar3 = uVar3 << 0xc | uVar3 >> 0x14;
  state[b] = uVar3;
  uVar3 = uVar3 + state[a];
  state[a] = uVar3;
  uVar3 = uVar3 ^ state[d];
  uVar3 = uVar3 << 8 | uVar3 >> 0x18;
  state[d] = uVar3;
  uVar3 = uVar3 + state[c];
  state[c] = uVar3;
  uVar3 = uVar3 ^ state[b];
  state[b] = uVar3 << 7 | uVar3 >> 0x19;
  return;
}

Assistant:

static inline void chacha20_quarter_round( uint32_t state[16],
                                           size_t a,
                                           size_t b,
                                           size_t c,
                                           size_t d )
{
    /* a += b; d ^= a; d <<<= 16; */
    state[a] += state[b];
    state[d] ^= state[a];
    state[d] = ROTL32( state[d], 16 );

    /* c += d; b ^= c; b <<<= 12 */
    state[c] += state[d];
    state[b] ^= state[c];
    state[b] = ROTL32( state[b], 12 );

    /* a += b; d ^= a; d <<<= 8; */
    state[a] += state[b];
    state[d] ^= state[a];
    state[d] = ROTL32( state[d], 8 );

    /* c += d; b ^= c; b <<<= 7; */
    state[c] += state[d];
    state[b] ^= state[c];
    state[b] = ROTL32( state[b], 7 );
}